

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

int uv__signal_loop_fork(uv_loop_t *loop)

{
  uv_signal_t *sh;
  uv_handle_t *handle;
  uv__queue *q;
  uv_loop_t *loop_local;
  
  if (loop->signal_pipefd[0] == -1) {
    loop_local._4_4_ = 0;
  }
  else {
    uv__io_stop(loop,&loop->signal_io_watcher,1);
    uv__close(loop->signal_pipefd[0]);
    uv__close(loop->signal_pipefd[1]);
    loop->signal_pipefd[0] = -1;
    loop->signal_pipefd[1] = -1;
    for (handle = (uv_handle_t *)(loop->handle_queue).next;
        handle != (uv_handle_t *)&loop->handle_queue; handle = (uv_handle_t *)handle->data) {
      if (*(int *)&handle[-1].next_closing == 0x10) {
        handle[1].type = UV_UNKNOWN_HANDLE;
        *(undefined4 *)&handle[1].field_0x14 = 0;
      }
    }
    loop_local._4_4_ = uv__signal_loop_once_init(loop);
  }
  return loop_local._4_4_;
}

Assistant:

int uv__signal_loop_fork(uv_loop_t* loop) {
  struct uv__queue* q;

  if (loop->signal_pipefd[0] == -1)
    return 0;
  uv__io_stop(loop, &loop->signal_io_watcher, POLLIN);
  uv__close(loop->signal_pipefd[0]);
  uv__close(loop->signal_pipefd[1]);
  loop->signal_pipefd[0] = -1;
  loop->signal_pipefd[1] = -1;

  uv__queue_foreach(q, &loop->handle_queue) {
    uv_handle_t* handle = uv__queue_data(q, uv_handle_t, handle_queue);
    uv_signal_t* sh;

    if (handle->type != UV_SIGNAL)
      continue;

    sh = (uv_signal_t*) handle;
    sh->caught_signals = 0;
    sh->dispatched_signals = 0;
  }

  return uv__signal_loop_once_init(loop);
}